

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

cf_char_t * cf_strcpy_s(cf_char_t *dst,cf_size_t dstsize,cf_char_t *src)

{
  cf_size_t cVar1;
  cf_void_t *pcVar2;
  
  if (src != (cf_char_t *)0x0 && dst != (cf_char_t *)0x0) {
    cVar1 = cf_strlen(src);
    if (cVar1 + 1 <= dstsize) {
      pcVar2 = cf_memcpy_s(dst,dstsize,src,cVar1 + 1);
      if (pcVar2 != (cf_void_t *)0x0) {
        return dst;
      }
      return (cf_char_t *)0x0;
    }
  }
  return (cf_char_t *)0x0;
}

Assistant:

cf_char_t* cf_strcpy_s(cf_char_t* dst, cf_size_t dstsize, const cf_char_t* src) {
    cf_size_t srcsize;
    if(!dst || !src) return CF_NULL_PTR;

    srcsize = cf_strlen(src) + 1;
    if(srcsize > dstsize) return CF_NULL_PTR;
    if(!cf_memcpy_s(dst, dstsize, src, srcsize)) return CF_NULL_PTR;
    return dst;
}